

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O0

int write_mtree_entry(archive_write *a,mtree_entry_conflict *me)

{
  mode_t mVar1;
  mtree_writer *mtree_00;
  uint uVar2;
  archive_string *local_38;
  int local_30;
  int ret;
  int keys;
  archive_string *str;
  mtree_writer *mtree;
  mtree_entry_conflict *me_local;
  archive_write *a_local;
  
  mtree_00 = (mtree_writer *)a->format_data;
  if (me->dir_info != (dir_info *)0x0) {
    if (mtree_00->classic != 0) {
      if (mtree_00->dironly == 0) {
        archive_strappend_char(&mtree_00->buf,'\n');
      }
      if ((me->parentdir).s == (char *)0x0) {
        archive_string_sprintf(&mtree_00->buf,"# %s\n",(me->basename).s);
      }
      else {
        archive_string_sprintf(&mtree_00->buf,"# %s/%s\n",(me->parentdir).s,(me->basename).s);
      }
    }
    if (mtree_00->output_global_set != 0) {
      write_global(mtree_00);
    }
  }
  (mtree_00->ebuf).length = 0;
  if ((mtree_00->indent == 0) && (mtree_00->classic == 0)) {
    local_38 = &mtree_00->buf;
  }
  else {
    local_38 = &mtree_00->ebuf;
  }
  if ((mtree_00->classic == 0) && ((me->parentdir).s != (char *)0x0)) {
    mtree_quote(local_38,(me->parentdir).s);
    archive_strappend_char(local_38,'/');
  }
  mtree_quote(local_38,(me->basename).s);
  uVar2 = get_global_set_keys(mtree_00,me);
  if ((((uVar2 & 0x400) != 0) && (me->nlink != 1)) && (me->filetype != 0x4000)) {
    archive_string_sprintf(local_38," nlink=%u",(ulong)me->nlink);
  }
  if (((uVar2 & 0x20) != 0) && ((me->gname).length != 0)) {
    archive_strcat(local_38," gname=");
    mtree_quote(local_38,(me->gname).s);
  }
  if (((uVar2 & 0x200000) != 0) && ((me->uname).length != 0)) {
    archive_strcat(local_38," uname=");
    mtree_quote(local_38,(me->uname).s);
  }
  if ((uVar2 & 8) != 0) {
    if ((me->fflags_text).length == 0) {
      if (((mtree_00->set).processing != 0) && (((mtree_00->set).keys & 8U) != 0)) {
        archive_strcat(local_38," flags=none");
      }
    }
    else {
      archive_strcat(local_38," flags=");
      mtree_quote(local_38,(me->fflags_text).s);
    }
  }
  if ((uVar2 & 0x40000) != 0) {
    archive_string_sprintf(local_38," time=%jd.%jd",me->mtime,me->mtime_nsec);
  }
  if ((uVar2 & 0x200) != 0) {
    archive_string_sprintf(local_38," mode=%o",(ulong)me->mode);
  }
  if ((uVar2 & 0x10) != 0) {
    archive_string_sprintf(local_38," gid=%jd",me->gid);
  }
  if ((uVar2 & 0x100000) != 0) {
    archive_string_sprintf(local_38," uid=%jd",me->uid);
  }
  if ((uVar2 & 0x4000000) != 0) {
    archive_string_sprintf(local_38," inode=%jd",me->ino);
  }
  if ((uVar2 & 0x8000000) != 0) {
    archive_string_sprintf(local_38," resdevice=native,%ju,%ju",me->devmajor,me->devminor);
  }
  mVar1 = me->filetype;
  if (mVar1 == 0x1000) {
    if ((uVar2 & 0x80000) != 0) {
      archive_strcat(local_38," type=fifo");
    }
  }
  else if (mVar1 == 0x2000) {
    if ((uVar2 & 0x80000) != 0) {
      archive_strcat(local_38," type=char");
    }
    if ((uVar2 & 2) != 0) {
      archive_string_sprintf(local_38," device=native,%ju,%ju",me->rdevmajor,me->rdevminor);
    }
  }
  else if (mVar1 == 0x4000) {
    if ((uVar2 & 0x80000) != 0) {
      archive_strcat(local_38," type=dir");
    }
  }
  else if (mVar1 == 0x6000) {
    if ((uVar2 & 0x80000) != 0) {
      archive_strcat(local_38," type=block");
    }
    if ((uVar2 & 2) != 0) {
      archive_string_sprintf(local_38," device=native,%ju,%ju",me->rdevmajor,me->rdevminor);
    }
  }
  else {
    if (mVar1 != 0x8000) {
      if (mVar1 == 0xa000) {
        if ((uVar2 & 0x80000) != 0) {
          archive_strcat(local_38," type=link");
        }
        if ((uVar2 & 0x10000) != 0) {
          archive_strcat(local_38," link=");
          mtree_quote(local_38,(me->symlink).s);
        }
        goto LAB_001ec265;
      }
      if (mVar1 == 0xc000) {
        if ((uVar2 & 0x80000) != 0) {
          archive_strcat(local_38," type=socket");
        }
        goto LAB_001ec265;
      }
    }
    if ((uVar2 & 0x80000) != 0) {
      archive_strcat(local_38," type=file");
    }
    if ((uVar2 & 0x8000) != 0) {
      archive_string_sprintf(local_38," size=%jd",me->size);
    }
  }
LAB_001ec265:
  if (me->reg_info != (reg_info *)0x0) {
    sum_write(local_38,me->reg_info);
  }
  archive_strappend_char(local_38,'\n');
  if ((mtree_00->indent != 0) || (mtree_00->classic != 0)) {
    mtree_indent(mtree_00);
  }
  if ((mtree_00->buf).length < 0x8001) {
    local_30 = 0;
  }
  else {
    local_30 = __archive_write_output(a,(mtree_00->buf).s,(mtree_00->buf).length);
    (mtree_00->buf).length = 0;
  }
  return local_30;
}

Assistant:

static int
write_mtree_entry(struct archive_write *a, struct mtree_entry *me)
{
	struct mtree_writer *mtree = a->format_data;
	struct archive_string *str;
	int keys, ret;

	if (me->dir_info) {
		if (mtree->classic) {
			/*
			 * Output a comment line to describe the full
			 * pathname of the entry as mtree utility does
			 * while generating classic format.
			 */
			if (!mtree->dironly)
				archive_strappend_char(&mtree->buf, '\n');
			if (me->parentdir.s)
				archive_string_sprintf(&mtree->buf,
				    "# %s/%s\n",
				    me->parentdir.s, me->basename.s);
			else
				archive_string_sprintf(&mtree->buf,
				    "# %s\n",
				    me->basename.s);
		}
		if (mtree->output_global_set)
			write_global(mtree);
	}
	archive_string_empty(&mtree->ebuf);
	str = (mtree->indent || mtree->classic)? &mtree->ebuf : &mtree->buf;

	if (!mtree->classic && me->parentdir.s) {
		/*
		 * If generating format is not classic one(v1), output
		 * a full pathname.
		 */
		mtree_quote(str, me->parentdir.s);
		archive_strappend_char(str, '/');
	}
	mtree_quote(str, me->basename.s);

	keys = get_global_set_keys(mtree, me);
	if ((keys & F_NLINK) != 0 &&
	    me->nlink != 1 && me->filetype != AE_IFDIR)
		archive_string_sprintf(str, " nlink=%u", me->nlink);

	if ((keys & F_GNAME) != 0 && archive_strlen(&me->gname) > 0) {
		archive_strcat(str, " gname=");
		mtree_quote(str, me->gname.s);
	}
	if ((keys & F_UNAME) != 0 && archive_strlen(&me->uname) > 0) {
		archive_strcat(str, " uname=");
		mtree_quote(str, me->uname.s);
	}
	if ((keys & F_FLAGS) != 0) {
		if (archive_strlen(&me->fflags_text) > 0) {
			archive_strcat(str, " flags=");
			mtree_quote(str, me->fflags_text.s);
		} else if (mtree->set.processing &&
		    (mtree->set.keys & F_FLAGS) != 0)
			/* Overwrite the global parameter. */
			archive_strcat(str, " flags=none");
	}
	if ((keys & F_TIME) != 0)
		archive_string_sprintf(str, " time=%jd.%jd",
		    (intmax_t)me->mtime, (intmax_t)me->mtime_nsec);
	if ((keys & F_MODE) != 0)
		archive_string_sprintf(str, " mode=%o", (unsigned int)me->mode);
	if ((keys & F_GID) != 0)
		archive_string_sprintf(str, " gid=%jd", (intmax_t)me->gid);
	if ((keys & F_UID) != 0)
		archive_string_sprintf(str, " uid=%jd", (intmax_t)me->uid);

	if ((keys & F_INO) != 0)
		archive_string_sprintf(str, " inode=%jd", (intmax_t)me->ino);
	if ((keys & F_RESDEV) != 0) {
		archive_string_sprintf(str,
		    " resdevice=native,%ju,%ju",
		    (uintmax_t)me->devmajor,
		    (uintmax_t)me->devminor);
	}

	switch (me->filetype) {
	case AE_IFLNK:
		if ((keys & F_TYPE) != 0)
			archive_strcat(str, " type=link");
		if ((keys & F_SLINK) != 0) {
			archive_strcat(str, " link=");
			mtree_quote(str, me->symlink.s);
		}
		break;
	case AE_IFSOCK:
		if ((keys & F_TYPE) != 0)
			archive_strcat(str, " type=socket");
		break;
	case AE_IFCHR:
		if ((keys & F_TYPE) != 0)
			archive_strcat(str, " type=char");
		if ((keys & F_DEV) != 0) {
			archive_string_sprintf(str,
			    " device=native,%ju,%ju",
			    (uintmax_t)me->rdevmajor,
			    (uintmax_t)me->rdevminor);
		}
		break;
	case AE_IFBLK:
		if ((keys & F_TYPE) != 0)
			archive_strcat(str, " type=block");
		if ((keys & F_DEV) != 0) {
			archive_string_sprintf(str,
			    " device=native,%ju,%ju",
			    (uintmax_t)me->rdevmajor,
			    (uintmax_t)me->rdevminor);
		}
		break;
	case AE_IFDIR:
		if ((keys & F_TYPE) != 0)
			archive_strcat(str, " type=dir");
		break;
	case AE_IFIFO:
		if ((keys & F_TYPE) != 0)
			archive_strcat(str, " type=fifo");
		break;
	case AE_IFREG:
	default:	/* Handle unknown file types as regular files. */
		if ((keys & F_TYPE) != 0)
			archive_strcat(str, " type=file");
		if ((keys & F_SIZE) != 0)
			archive_string_sprintf(str, " size=%jd",
			    (intmax_t)me->size);
		break;
	}

	/* Write a bunch of sum. */
	if (me->reg_info)
		sum_write(str, me->reg_info);

	archive_strappend_char(str, '\n');
	if (mtree->indent || mtree->classic)
		mtree_indent(mtree);

	if (mtree->buf.length > 32768) {
		ret = __archive_write_output(
			a, mtree->buf.s, mtree->buf.length);
		archive_string_empty(&mtree->buf);
	} else
		ret = ARCHIVE_OK;
	return (ret);
}